

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *this,
          CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *other)

{
  GetAsyncCommandResponse_SetupTracing *this_00;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *other_local;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (GetAsyncCommandResponse_SetupTracing *)operator_new(0x58);
  perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing::GetAsyncCommandResponse_SetupTracing
            (this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_SetupTracing>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }